

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

CTypeID cp_decl_enum(CPState *cp,CPDecl *sdecl)

{
  CTypeID CVar1;
  int iVar2;
  CTypeID id;
  CType *pCStack_b0;
  CTypeID constid;
  CType *ct;
  GCstr *name;
  CTypeID lastid;
  CPValue k;
  CTSize esize;
  CTInfo einfo;
  CTypeID eid;
  CPDecl *sdecl_local;
  CPState *cp_local;
  
  CVar1 = cp_struct_name(cp,sdecl,0x50000001);
  k.id = 0x5002000a;
  k.field_0.i32 = 4;
  iVar2 = cp_opt(cp,0x7b);
  if (iVar2 != 0) {
    name._4_4_ = 0;
    lastid = 9;
    name._0_4_ = CVar1;
    do {
      ct = (CType *)cp->str;
      if (cp->tok != 0x100) {
        cp_err_token(cp,0x100);
      }
      if ((cp->val).id != 0) {
        cp_errmsg(cp,0,LJ_ERR_FFI_REDEF,(GCstr *)ct + 1);
      }
      cp_next(cp);
      iVar2 = cp_opt(cp,0x3d);
      if (iVar2 != 0) {
        cp_expr_kint(cp,(CPValue *)((long)&name + 4));
        if (lastid == 10) {
          if (-1 < (int)name._4_4_) {
            lastid = 9;
          }
        }
        else {
          lastid = 9;
          if ((int)name._4_4_ < 0) {
            k.id = 0x50020009;
          }
        }
      }
      id = lj_ctype_new(cp->cts,&stack0xffffffffffffff50);
      cp->cts->tab[(CTypeID)name].sib = (CTypeID1)id;
      *(byte *)&ct->sib = (byte)ct->sib | 0x20;
      (pCStack_b0->name).gcptr64 = (uint64_t)ct;
      pCStack_b0->info = (lastid | 0x2000000) + 0xb0000000;
      pCStack_b0->size = name._4_4_;
      if (name._4_4_ + 1 == 0x80000000) {
        lastid = 10;
      }
      name._0_4_ = id;
      name._4_4_ = name._4_4_ + 1;
      lj_ctype_addname(cp->cts,pCStack_b0,id);
      iVar2 = cp_opt(cp,0x2c);
    } while ((iVar2 != 0) && (cp->tok != 0x7d));
    cp_check(cp,0x7d);
    cp->cts->tab[CVar1].info = k.id;
    cp->cts->tab[CVar1].size = (CTSize)k.field_0;
  }
  return CVar1;
}

Assistant:

static CTypeID cp_decl_enum(CPState *cp, CPDecl *sdecl)
{
  CTypeID eid = cp_struct_name(cp, sdecl, CTINFO(CT_ENUM, CTID_VOID));
  CTInfo einfo = CTINFO(CT_ENUM, CTALIGN(2) + CTID_UINT32);
  CTSize esize = 4;  /* Only 32 bit enums are supported. */
  if (cp_opt(cp, '{')) {  /* Enum definition. */
    CPValue k;
    CTypeID lastid = eid;
    k.u32 = 0;
    k.id = CTID_INT32;
    do {
      GCstr *name = cp->str;
      if (cp->tok != CTOK_IDENT) cp_err_token(cp, CTOK_IDENT);
      if (cp->val.id) cp_errmsg(cp, 0, LJ_ERR_FFI_REDEF, strdata(name));
      cp_next(cp);
      if (cp_opt(cp, '=')) {
	cp_expr_kint(cp, &k);
	if (k.id == CTID_UINT32) {
	  /* C99 says that enum constants are always (signed) integers.
	  ** But since unsigned constants like 0x80000000 are quite common,
	  ** those are left as uint32_t.
	  */
	  if (k.i32 >= 0) k.id = CTID_INT32;
	} else {
	  /* OTOH it's common practice and even mandated by some ABIs
	  ** that the enum type itself is unsigned, unless there are any
	  ** negative constants.
	  */
	  k.id = CTID_INT32;
	  if (k.i32 < 0) einfo = CTINFO(CT_ENUM, CTALIGN(2) + CTID_INT32);
	}
      }
      /* Add named enum constant. */
      {
	CType *ct;
	CTypeID constid = lj_ctype_new(cp->cts, &ct);
	ctype_get(cp->cts, lastid)->sib = constid;
	lastid = constid;
	ctype_setname(ct, name);
	ct->info = CTINFO(CT_CONSTVAL, CTF_CONST|k.id);
	ct->size = k.u32++;
	if (k.u32 == 0x80000000u) k.id = CTID_UINT32;
	lj_ctype_addname(cp->cts, ct, constid);
      }
      if (!cp_opt(cp, ',')) break;
    } while (cp->tok != '}');  /* Trailing ',' is ok. */
    cp_check(cp, '}');
    /* Complete enum. */
    ctype_get(cp->cts, eid)->info = einfo;
    ctype_get(cp->cts, eid)->size = esize;
  }
  return eid;
}